

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<std::vector<bool,std::allocator<bool>>,void>
               (vector<bool,_std::allocator<bool>_> *container,ostream *os)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong *puVar5;
  long lVar6;
  bool bVar7;
  
  std::operator<<(os,'{');
  puVar5 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  uVar4 = 0;
  lVar6 = 0;
  while( true ) {
    if ((puVar5 == puVar2) && (uVar4 == uVar1)) {
      if (lVar6 == 0) goto LAB_0011a085;
      goto LAB_0011a07a;
    }
    uVar3 = *puVar5;
    if ((lVar6 != 0) && (std::operator<<(os,','), lVar6 == 0x20)) break;
    std::operator<<(os,' ');
    PrintTo((1L << ((byte)uVar4 & 0x3f) & uVar3) != 0,os);
    lVar6 = lVar6 + 1;
    bVar7 = uVar4 == 0x3f;
    uVar4 = uVar4 + 1;
    puVar5 = puVar5 + bVar7;
    if (bVar7) {
      uVar4 = 0;
    }
  }
  std::operator<<(os," ...");
LAB_0011a07a:
  std::operator<<(os,' ');
LAB_0011a085:
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }